

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::translate_branch(Codegen *this,JumpInstruction *j)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JumpInstructionKind JVar2;
  Inst *pIVar3;
  undefined8 uVar4;
  pointer puVar5;
  LabelId LVar6;
  LabelId LVar7;
  bool bVar8;
  undefined3 uVar9;
  size_type sVar10;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *pvVar11;
  char cVar12;
  ConditionCode CVar13;
  Reg RVar14;
  Reg RVar15;
  Inst *pIVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  undefined **ppuVar19;
  Inst *pIVar20;
  long lVar21;
  pointer *__ptr;
  uint32_t in_R8D;
  pointer *__ptr_1;
  pointer puVar22;
  pointer *__ptr_2;
  pointer __p;
  string_view function_name;
  string_view function_name_00;
  string_view function_name_01;
  string_view function_name_02;
  string_view function_name_03;
  string_view function_name_04;
  BrInst *local_88;
  _Head_base<0UL,_arm::Inst_*,_false> local_80;
  string local_78;
  VarId local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_38;
  
  LVar6 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true;
  LVar7 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false;
  bVar8 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
  uVar9 = *(undefined3 *)
           &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
            _M_payload.super__Optional_payload_base<backend::codegen::LastJump>.field_0xd;
  *(undefined4 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_payload =
       *(undefined4 *)
        &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
         super__Optional_payload_base<backend::codegen::LastJump>._M_payload;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true = LVar6;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false = LVar7;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = bVar8;
  *(undefined3 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>.field_0xd = uVar9;
  cVar12 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload
           .super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
  if ((bool)cVar12 == true) {
    (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
    cVar12 = '\0';
  }
  JVar2 = j->kind;
  if (3 < (ulong)JVar2) {
    return;
  }
  ppuVar19 = (undefined **)
             ((long)&switchD_00166f7d::switchdataD_001b834c +
             (long)(int)(&switchD_00166f7d::switchdataD_001b834c)[JVar2]);
  switch(JVar2) {
  case Undefined:
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    puVar18 = (undefined8 *)operator_new(8);
    *puVar18 = std::__cxx11::string::operator=;
    *puVar17 = puVar18;
    __cxa_throw(puVar17,&std::exception*::typeinfo,0);
  case Return:
    if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
      RVar15 = arm::make_register(GeneralPurpose,0);
      if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) goto LAB_00167860;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_58.id = (j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
                    .super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
      RVar14 = get_or_alloc_vgp(this,&local_58);
      local_78._M_dataplus._M_p = (pointer)operator_new(0x38);
      *(Reg *)((long)local_78._M_dataplus._M_p + 0x28) = RVar14;
      *(undefined2 *)((long)local_78._M_dataplus._M_p + 0x2c) = 1;
      *(undefined4 *)((long)local_78._M_dataplus._M_p + 8) = 6;
      local_78._M_dataplus._M_p[0xc] = '\x10';
      *(undefined ***)local_78._M_dataplus._M_p = &PTR_display_001ed930;
      *(Reg *)((long)local_78._M_dataplus._M_p + 0x10) = RVar15;
      *(undefined1 *)((long)local_78._M_dataplus._M_p + 0x30) = 0;
      *(undefined ***)((long)local_78._M_dataplus._M_p + 0x20) = &PTR_display_001ed7c0;
      ppuVar19 = &PTR_display_001ed820;
      *(undefined ***)((long)local_78._M_dataplus._M_p + 0x18) = &PTR_display_001ed820;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_78)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 0x10))();
      }
    }
    function_name._M_str = (char *)ppuVar19;
    function_name._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    format_fn_end_label_abi_cxx11_
              (&local_78,(codegen *)(this->func->name)._M_string_length,function_name);
    pIVar16 = (Inst *)operator_new(0x38);
    sVar10 = local_78._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_48._8_4_ = local_78.field_2._8_4_;
      local_48._12_4_ = local_78.field_2._12_4_;
      local_78._M_dataplus._M_p = (pointer)&local_48;
    }
    local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
    local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
    local_58._8_8_ = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity._0_4_ =
         local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    pIVar16->op = B;
    pIVar16->cond = Always;
    (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed970;
    pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
    lVar21 = sVar10 + (long)local_78._M_dataplus._M_p;
    local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pIVar16 + 1),local_58.super_Displayable._vptr_Displayable,lVar21);
    *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.super_Displayable._vptr_Displayable != &local_48) {
      operator_delete(local_58.super_Displayable._vptr_Displayable,
                      local_48._M_allocated_capacity + 1);
    }
    local_88 = (BrInst *)0x0;
    local_80._M_head_impl = pIVar16;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
    break;
  case BrCond:
    this_00 = &this->inst;
    puVar22 = (this->inst).
              super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)this_00;
    if ((((ulong)((long)puVar22 -
                 (long)(this->inst).
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) ||
        (pIVar16 = puVar22[-2]._M_t.
                   super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar16->op != Mov)) ||
       (pIVar3 = puVar22[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar3->op != Mov)) {
LAB_00167108:
      uVar4 = *(undefined8 *)&j->bb_true;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = NotEqual;
      *(undefined8 *)
       ((long)&(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
               _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload + 4) =
           uVar4;
      if (cVar12 == '\0') {
        (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
        super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
      }
      if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
LAB_00167860:
        std::__throw_bad_optional_access();
      }
      local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_58.id = (j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
                    .super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
      RVar15 = get_or_alloc_vgp(this,&local_58);
      local_78._M_dataplus._M_p = (pointer)operator_new(0x38);
      *(undefined4 *)((long)local_78._M_dataplus._M_p + 8) = 0x18;
      local_78._M_dataplus._M_p[0xc] = '\x10';
      *(undefined ***)local_78._M_dataplus._M_p = &PTR_display_001ed930;
      *(Reg *)((long)local_78._M_dataplus._M_p + 0x10) = RVar15;
      *(undefined1 *)((long)local_78._M_dataplus._M_p + 0x30) = 1;
      *(undefined4 *)((long)local_78._M_dataplus._M_p + 0x20) = 0;
      *(undefined ***)((long)local_78._M_dataplus._M_p + 0x18) = &PTR_display_001ed820;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 0x10))();
      }
      function_name_00._M_str._0_4_ = j->bb_false;
      function_name_00._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_00._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                (&local_78,(codegen *)(this->func->name)._M_string_length,function_name_00,in_R8D);
      local_88 = (BrInst *)operator_new(0x38);
      sVar10 = local_78._M_string_length;
      paVar1 = &local_78.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        local_48._8_4_ = local_78.field_2._8_4_;
        local_48._12_4_ = local_78.field_2._12_4_;
        local_78._M_dataplus._M_p = (pointer)&local_48;
      }
      local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
      local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
      local_58._8_8_ = local_78._M_string_length;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity._0_4_ =
           local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      ((Inst *)local_88)->op = B;
      ((Inst *)local_88)->cond = Equal;
      (((Inst *)local_88)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001ed970;
      (((Inst *)((long)local_88 + 0x10))->super_Displayable)._vptr_Displayable =
           (_func_int **)((long)local_88 + 0x20);
      lVar21 = sVar10 + (long)local_78._M_dataplus._M_p;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)local_88 + 0x10),local_58.super_Displayable._vptr_Displayable,
                 lVar21);
      *(undefined4 *)&(((Inst *)((long)local_88 + 0x30))->super_Displayable)._vptr_Displayable = 0;
      local_80._M_head_impl = (Inst *)local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.super_Displayable._vptr_Displayable != &local_48) {
        operator_delete(local_58.super_Displayable._vptr_Displayable,
                        local_48._M_allocated_capacity + 1);
        local_80._M_head_impl = &local_88->super_Inst;
      }
      pvVar11 = local_38;
      local_88 = (BrInst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_38,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
      if (local_80._M_head_impl != (Inst *)0x0) {
        (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      local_80._M_head_impl = (Inst *)0x0;
      if (local_88 != (BrInst *)0x0) {
        std::default_delete<arm::BrInst>::operator()
                  ((default_delete<arm::BrInst> *)&local_88,local_88);
      }
      local_88 = (BrInst *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                 local_78.field_2._M_allocated_capacity._0_4_) + 1);
      }
      function_name_02._M_str._0_4_ = j->bb_true;
      function_name_02._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_02._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                (&local_78,(codegen *)(this->func->name)._M_string_length,function_name_02,in_R8D);
      pIVar16 = (Inst *)operator_new(0x38);
      sVar10 = local_78._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        local_48._8_4_ = local_78.field_2._8_4_;
        local_48._12_4_ = local_78.field_2._12_4_;
        local_78._M_dataplus._M_p = (pointer)&local_48;
      }
      local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
      local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
      local_58._8_8_ = local_78._M_string_length;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity._0_4_ =
           local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      pIVar16->op = B;
      pIVar16->cond = Always;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed970;
      pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
      lVar21 = sVar10 + (long)local_78._M_dataplus._M_p;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar16 + 1),local_58.super_Displayable._vptr_Displayable,lVar21);
      *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.super_Displayable._vptr_Displayable != &local_48) {
        operator_delete(local_58.super_Displayable._vptr_Displayable,
                        local_48._M_allocated_capacity + 1);
      }
      local_88 = (BrInst *)0x0;
      local_80._M_head_impl = pIVar16;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (pvVar11,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
    }
    else {
      if ((pIVar16->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001ed930) {
        pIVar16 = (Inst *)0x0;
      }
      pIVar20 = (Inst *)0x0;
      if ((pIVar3->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001ed930) {
        pIVar20 = pIVar3;
      }
      if (((((*(int *)&pIVar16[1].super_Displayable._vptr_Displayable !=
              *(int *)&pIVar20[1].super_Displayable._vptr_Displayable) ||
            (*(char *)&pIVar16[3].super_Displayable._vptr_Displayable != '\x01')) ||
           ((*(int *)&pIVar16[2].super_Displayable._vptr_Displayable != 0 ||
            ((*(char *)&pIVar20[3].super_Displayable._vptr_Displayable != '\x01' ||
             (*(int *)&pIVar20[2].super_Displayable._vptr_Displayable != 1)))))) ||
          (pIVar16->cond != Always)) || (CVar13 = pIVar20->cond, CVar13 == Always))
      goto LAB_00167108;
      puVar22 = puVar22 + -1;
      uVar4 = *(undefined8 *)&j->bb_true;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = CVar13;
      *(undefined8 *)
       ((long)&(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
               _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload + 4) =
           uVar4;
      if (cVar12 == '\0') {
        (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
        super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
      }
      (this->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar22;
      pIVar16 = (puVar22->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if (pIVar16 != (Inst *)0x0) {
        (*(pIVar16->super_Displayable)._vptr_Displayable[2])();
      }
      (puVar22->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar5 = (this->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar22 = puVar5 + -1;
      (this->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar22;
      pIVar16 = puVar5[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if (pIVar16 != (Inst *)0x0) {
        (*(pIVar16->super_Displayable)._vptr_Displayable[2])();
      }
      (puVar22->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      function_name_03._M_str._0_4_ = j->bb_false;
      function_name_03._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_03._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                (&local_78,(codegen *)(this->func->name)._M_string_length,function_name_03,in_R8D);
      CVar13 = arm::invert_cond(CVar13);
      local_88 = (BrInst *)operator_new(0x38);
      sVar10 = local_78._M_string_length;
      paVar1 = &local_78.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        local_48._8_4_ = local_78.field_2._8_4_;
        local_48._12_4_ = local_78.field_2._12_4_;
        local_78._M_dataplus._M_p = (pointer)&local_48;
      }
      local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
      local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
      local_58._8_8_ = local_78._M_string_length;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity._0_4_ =
           local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      ((Inst *)local_88)->op = B;
      ((Inst *)local_88)->cond = CVar13;
      (((Inst *)local_88)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001ed970;
      (((Inst *)((long)local_88 + 0x10))->super_Displayable)._vptr_Displayable =
           (_func_int **)((long)local_88 + 0x20);
      lVar21 = sVar10 + (long)local_78._M_dataplus._M_p;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)local_88 + 0x10),local_58.super_Displayable._vptr_Displayable,
                 lVar21);
      *(undefined4 *)&(((Inst *)((long)local_88 + 0x30))->super_Displayable)._vptr_Displayable = 0;
      local_80._M_head_impl = (Inst *)local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.super_Displayable._vptr_Displayable != &local_48) {
        operator_delete(local_58.super_Displayable._vptr_Displayable,
                        local_48._M_allocated_capacity + 1);
        local_80._M_head_impl = &local_88->super_Inst;
      }
      pvVar11 = local_38;
      local_88 = (BrInst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_38,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
      if (local_80._M_head_impl != (Inst *)0x0) {
        (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      local_80._M_head_impl = (Inst *)0x0;
      if (local_88 != (BrInst *)0x0) {
        std::default_delete<arm::BrInst>::operator()
                  ((default_delete<arm::BrInst> *)&local_88,local_88);
      }
      local_88 = (BrInst *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                 local_78.field_2._M_allocated_capacity._0_4_) + 1);
      }
      function_name_04._M_str._0_4_ = j->bb_true;
      function_name_04._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_04._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                (&local_78,(codegen *)(this->func->name)._M_string_length,function_name_04,in_R8D);
      pIVar16 = (Inst *)operator_new(0x38);
      sVar10 = local_78._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        local_48._8_4_ = local_78.field_2._8_4_;
        local_48._12_4_ = local_78.field_2._12_4_;
        local_78._M_dataplus._M_p = (pointer)&local_48;
      }
      local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
      local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
      local_58._8_8_ = local_78._M_string_length;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity._0_4_ =
           local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      pIVar16->op = B;
      pIVar16->cond = Always;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed970;
      pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
      lVar21 = sVar10 + (long)local_78._M_dataplus._M_p;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar16 + 1),local_58.super_Displayable._vptr_Displayable,lVar21);
      *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.super_Displayable._vptr_Displayable != &local_48) {
        operator_delete(local_58.super_Displayable._vptr_Displayable,
                        local_48._M_allocated_capacity + 1);
      }
      local_88 = (BrInst *)0x0;
      local_80._M_head_impl = pIVar16;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (pvVar11,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
    }
    if (local_80._M_head_impl != (Inst *)0x0) {
      (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      local_80._M_head_impl = (Inst *)0x0;
      if (local_88 != (BrInst *)0x0) {
        std::default_delete<arm::BrInst>::operator()
                  ((default_delete<arm::BrInst> *)&local_88,local_88);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return;
    }
    goto LAB_001673c6;
  case Br:
    function_name_01._M_str._0_4_ = j->bb_true;
    function_name_01._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    function_name_01._M_str._4_4_ = 0;
    format_bb_label_abi_cxx11_
              (&local_78,(codegen *)(this->func->name)._M_string_length,function_name_01,in_R8D);
    pIVar16 = (Inst *)operator_new(0x38);
    sVar10 = local_78._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_48._8_4_ = local_78.field_2._8_4_;
      local_48._12_4_ = local_78.field_2._12_4_;
      local_78._M_dataplus._M_p = (pointer)&local_48;
    }
    local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
    local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
    local_58._8_8_ = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity._0_4_ =
         local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    pIVar16->op = B;
    pIVar16->cond = Always;
    (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed970;
    pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
    lVar21 = (long)local_78._M_dataplus._M_p + sVar10;
    local_58.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pIVar16 + 1),local_58.super_Displayable._vptr_Displayable,lVar21);
    *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.super_Displayable._vptr_Displayable != &local_48) {
      operator_delete(local_58.super_Displayable._vptr_Displayable,
                      local_48._M_allocated_capacity + 1);
    }
    local_88 = (BrInst *)0x0;
    local_80._M_head_impl = pIVar16;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
  }
  if (local_80._M_head_impl != (Inst *)0x0) {
    (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
    local_80._M_head_impl = (Inst *)0x0;
    if (local_88 != (BrInst *)0x0) {
      std::default_delete<arm::BrInst>::operator()
                ((default_delete<arm::BrInst> *)&local_88,local_88);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_001673c6:
    local_88 = (BrInst *)0x0;
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                             local_78.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return;
}

Assistant:

void Codegen::translate_branch(mir::inst::JumpInstruction& j) {
  last_jump = std::move(this_jump);
  this_jump = std::nullopt;
  switch (j.kind) {
    case mir::inst::JumpInstructionKind::Br:
      inst.push_back(std::make_unique<BrInst>(
          OpCode::B, format_bb_label(func.name, j.bb_true)));
      break;
    case mir::inst::JumpInstructionKind::BrCond: {
      auto back = inst.end() - 2;

      // Find if a comparison exists
      std::optional<ConditionCode> cond = std::nullopt;
      if (inst.size() >= 2) {
        auto b1 = back->get();
        auto b2 = (back + 1)->get();
        if (b1->op == arm::OpCode::Mov && b2->op == arm::OpCode::Mov) {
          auto b1m = dynamic_cast<Arith2Inst*>(b1);
          auto b2m = dynamic_cast<Arith2Inst*>(b2);
          if (b1m->r1 == b2m->r1 && b1m->r2 == 0 && b2m->r2 == 1 &&
              b1m->cond == arm::ConditionCode::Always &&
              b2m->cond != arm::ConditionCode::Always) {
            cond = {b2m->cond};
          }
        }
      }
      if (cond) {
        this_jump = LastJump{cond.value(), j.bb_true, j.bb_false};
        inst.pop_back();
        inst.pop_back();
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            invert_cond(cond.value())));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      } else {
        this_jump = LastJump{ConditionCode::NotEqual, j.bb_true, j.bb_false};
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Cmp, translate_var_reg(j.cond_or_ret.value()),
            Operand2(0)));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            ConditionCode::Equal));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      }
    } break;
    case mir::inst::JumpInstructionKind::Return:
      if (j.cond_or_ret.has_value()) {
        // Move return value to its register
        // if (j.cond_or_ret.value().id != 0) {
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Mov, make_register(arm::RegisterKind::GeneralPurpose, 0),
            RegisterOperand(translate_var_reg(j.cond_or_ret.value()))));
        // }
      }
      inst.push_back(
          std::make_unique<BrInst>(OpCode::B, format_fn_end_label(func.name)));
      // Jumps to function end, the rest is cleanup generation in function
      // `generate_return_and_cleanup`
      break;
    case mir::inst::JumpInstructionKind::Undefined:
      // WARN: Error about undefined blocks
      throw new std::exception();
      break;
    case mir::inst::JumpInstructionKind::Unreachable:
      // TODO: Discard unreachable blocks beforhand
      break;
  }
}